

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O0

uint64_t mul_mod_p(uint64_t a,uint64_t b)

{
  uint64_t uVar1;
  uint64_t t;
  uint64_t m;
  uint64_t b_local;
  uint64_t a_local;
  
  t = 0;
  b_local = a;
  for (m = b; m != 0; m = m >> 1) {
    if ((m & 1) != 0) {
      uVar1 = b_local;
      if (-b_local - 0x3b <= t) {
        uVar1 = -(-b_local - 0x3b);
      }
      t = t + uVar1;
    }
    if (b_local < -b_local - 0x3b) {
      b_local = b_local << 1;
    }
    else {
      b_local = b_local * 2 + 0x3b;
    }
  }
  return t;
}

Assistant:

static inline uint64_t
mul_mod_p(uint64_t a, uint64_t b) {
	uint64_t m = 0;
	while(b) {
		if(b&1) {
			uint64_t t = P-a;
			if ( m >= t) {
				m -= t;
			} else {
				m += a;
			}
		}
		if (a >= P - a) {
			a = a * 2 - P;
		} else {
			a = a * 2;
		}
		b>>=1;
	}
	return m;
}